

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.h
# Opt level: O3

my_set<unsigned_long> * __thiscall
merlin::my_set<unsigned_long>::operator|=(my_set<unsigned_long> *this,my_set<unsigned_long> *b)

{
  my_set<unsigned_long> local_30;
  
  operator|(&local_30,this,b);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_30);
  if (local_30.super_my_vector<unsigned_long>.
      super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.super_my_vector<unsigned_long>.
                    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return this;
}

Assistant:

my_set<T>& my_set<T>::operator|=(const my_set<T>& b) {
	*this = *this | b;
	return *this;
}